

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_attach(lua_State *L)

{
  byte bVar1;
  int iVar2;
  GCfunc *pGVar3;
  GCstr *pGVar4;
  GCstr *pGVar5;
  TValue *pTVar6;
  MSize MVar7;
  
  pGVar3 = lj_lib_checkfunc(L,1);
  pGVar4 = lj_lib_optstr(L,2);
  luaL_findtable(L,-10000,"_VMEVENTS",4);
  if (pGVar4 != (GCstr *)0x0) {
    pGVar5 = pGVar4 + 1;
    MVar7 = pGVar4->len;
    while (bVar1 = (byte)(pGVar5->nextgc).gcptr64, bVar1 != 0) {
      pGVar5 = (GCstr *)((long)&(pGVar5->nextgc).gcptr64 + 1);
      MVar7 = MVar7 ^ (MVar7 << 6 | MVar7 >> 0x1a) + (uint)bVar1;
    }
    lua_pushvalue(L,1);
    lua_rawseti(L,-2,MVar7 << 3);
    *(undefined1 *)((L->glref).ptr64 + 0x93) = 0xff;
    return 0;
  }
  pTVar6 = L->top;
  L->top = pTVar6 + 1;
  do {
    pTVar6->u64 = 0xffffffffffffffff;
    do {
      iVar2 = lua_next(L,-2);
      if (iVar2 == 0) {
        return 0;
      }
      pTVar6 = L->top;
      L->top = pTVar6 + -1;
    } while ((pTVar6[-1].field_4.it >> 0xf != 0x1fff7) ||
            (pGVar3 != (GCfunc *)((ulong)pTVar6[-1].field_4 & 0x7fffffffffff)));
    pTVar6 = lj_tab_set(L,(GCtab *)(pTVar6[-3].u64 & 0x7fffffffffff),pTVar6 + -2);
  } while( true );
}

Assistant:

LJLIB_CF(jit_attach)
{
#ifdef LUAJIT_DISABLE_VMEVENT
  luaL_error(L, "vmevent API disabled");
#else
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  GCstr *s = lj_lib_optstr(L, 2);
  luaL_findtable(L, LUA_REGISTRYINDEX, LJ_VMEVENTS_REGKEY, LJ_VMEVENTS_HSIZE);
  if (s) {  /* Attach to given event. */
    const uint8_t *p = (const uint8_t *)strdata(s);
    uint32_t h = s->len;
    while (*p) h = h ^ (lj_rol(h, 6) + *p++);
    lua_pushvalue(L, 1);
    lua_rawseti(L, -2, VMEVENT_HASHIDX(h));
    G(L)->vmevmask = VMEVENT_NOCACHE;  /* Invalidate cache. */
  } else {  /* Detach if no event given. */
    setnilV(L->top++);
    while (lua_next(L, -2)) {
      L->top--;
      if (tvisfunc(L->top) && funcV(L->top) == fn) {
	setnilV(lj_tab_set(L, tabV(L->top-2), L->top-1));
      }
    }
  }
#endif
  return 0;
}